

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O1

void __thiscall
cmMakefile::AddSourceGroup
          (cmMakefile *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *name,char *regex)

{
  pointer pbVar1;
  bool bVar2;
  cmSourceGroup *this_00;
  string *psVar3;
  long lVar4;
  long lVar5;
  uint uVar6;
  uint uVar7;
  long lVar8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  currentName;
  char *local_1d8;
  ulong local_1d0;
  string local_1c8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1a8;
  cmSourceGroup local_190;
  
  local_1a8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1a8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1a8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar6 = (int)((ulong)((long)(name->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_finish -
                       (long)(name->
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_start) >> 5) - 1;
  local_1d8 = regex;
  if ((int)uVar6 < 0) {
    this_00 = (cmSourceGroup *)0x0;
    uVar7 = uVar6;
  }
  else {
    lVar8 = (ulong)uVar6 * 0x20 + 0x20;
    lVar4 = (ulong)uVar6 + 1;
    local_1d0 = (ulong)uVar6;
    do {
      pbVar1 = (name->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      _M_assign_aux<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_1a8,
                 pbVar1,(long)&(pbVar1->_M_dataplus)._M_p + lVar8);
      this_00 = GetSourceGroup(this,&local_1a8);
      if (this_00 != (cmSourceGroup *)0x0) {
        uVar6 = (int)lVar4 - 1;
        goto LAB_001cadda;
      }
      lVar8 = lVar8 + -0x20;
      lVar5 = lVar4 + -1;
      bVar2 = 0 < lVar4;
      lVar4 = lVar5;
    } while (lVar5 != 0 && bVar2);
    uVar6 = 0xffffffff;
    this_00 = (cmSourceGroup *)0x0;
LAB_001cadda:
    uVar7 = (uint)local_1d0;
  }
  if (uVar6 == uVar7) {
    if (this_00 != (cmSourceGroup *)0x0 && local_1d8 != (char *)0x0) {
      cmSourceGroup::SetGroupRegex(this_00,local_1d8);
    }
  }
  else {
    if (uVar6 == 0xffffffff) {
      std::vector<cmSourceGroup,std::allocator<cmSourceGroup>>::
      emplace_back<std::__cxx11::string_const&,char_const*&>
                ((vector<cmSourceGroup,std::allocator<cmSourceGroup>> *)&this->SourceGroups,
                 (name->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start,&local_1d8);
      this_00 = GetSourceGroup(this,&local_1a8);
      uVar6 = 0;
    }
    if (this_00 == (cmSourceGroup *)0x0) {
      cmSystemTools::Error("Could not create source group ",(char *)0x0,(char *)0x0,(char *)0x0);
    }
    else {
      if ((int)uVar7 < (int)uVar6) {
        uVar7 = uVar6;
      }
      lVar8 = ~(long)(int)uVar7 + (long)(int)uVar6;
      lVar4 = (long)(int)uVar6 * 0x20;
      while( true ) {
        lVar8 = lVar8 + 1;
        if (lVar8 == 0) break;
        pbVar1 = (name->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
        lVar5 = *(long *)((long)&pbVar1[1]._M_dataplus._M_p + lVar4);
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_1c8,lVar5,
                   *(long *)((long)&pbVar1[1]._M_string_length + lVar4) + lVar5);
        psVar3 = cmSourceGroup::GetFullName_abi_cxx11_(this_00);
        cmSourceGroup::cmSourceGroup(&local_190,&local_1c8,(char *)0x0,(psVar3->_M_dataplus)._M_p);
        cmSourceGroup::AddChild(this_00,&local_190);
        cmSourceGroup::~cmSourceGroup(&local_190);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
          operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
        }
        this_00 = cmSourceGroup::LookupChild
                            (this_00,(string *)
                                     ((long)&(name->
                                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             )._M_impl.super__Vector_impl_data._M_start[1].
                                             _M_dataplus._M_p + lVar4));
        lVar4 = lVar4 + 0x20;
      }
      cmSourceGroup::SetGroupRegex(this_00,local_1d8);
    }
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_1a8);
  return;
}

Assistant:

void cmMakefile::AddSourceGroup(const std::vector<std::string>& name,
                                const char* regex)
{
  cmSourceGroup* sg = nullptr;
  std::vector<std::string> currentName;
  int i = 0;
  const int lastElement = static_cast<int>(name.size() - 1);
  for (i = lastElement; i >= 0; --i) {
    currentName.assign(name.begin(), name.begin() + i + 1);
    sg = this->GetSourceGroup(currentName);
    if (sg != nullptr) {
      break;
    }
  }

  // i now contains the index of the last found component
  if (i == lastElement) {
    // group already exists, replace its regular expression
    if (regex && sg) {
      // We only want to set the regular expression.  If there are already
      // source files in the group, we don't want to remove them.
      sg->SetGroupRegex(regex);
    }
    return;
  }
  if (i == -1) {
    // group does not exist nor belong to any existing group
    // add its first component
    this->SourceGroups.emplace_back(name[0], regex);
    sg = this->GetSourceGroup(currentName);
    i = 0; // last component found
  }
  if (!sg) {
    cmSystemTools::Error("Could not create source group ");
    return;
  }
  // build the whole source group path
  for (++i; i <= lastElement; ++i) {
    sg->AddChild(cmSourceGroup(name[i], nullptr, sg->GetFullName().c_str()));
    sg = sg->LookupChild(name[i]);
  }

  sg->SetGroupRegex(regex);
}